

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_iter.cc
# Opt level: O2

void __thiscall leveldb::anon_unknown_3::DBIter::Prev(DBIter *this)

{
  Comparator *pCVar1;
  int iVar2;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  size_t extraout_RDX;
  long in_FS_OFFSET;
  Slice SVar3;
  pointer local_60;
  size_type local_58;
  Slice local_50;
  Slice local_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->valid_ == false) {
    __assert_fail("valid_",
                  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_iter.cc"
                  ,0xd2,"virtual void leveldb::(anonymous namespace)::DBIter::Prev()");
  }
  if (this->direction_ == kForward) {
    iVar2 = (*this->iter_->_vptr_Iterator[2])();
    if ((char)iVar2 == '\0') {
      __assert_fail("iter_->Valid()",
                    "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/leveldb/db/db_iter.cc"
                    ,0xd7,"virtual void leveldb::(anonymous namespace)::DBIter::Prev()");
    }
    local_40.data_._0_4_ = (*this->iter_->_vptr_Iterator[8])();
    local_40.data_._4_4_ = extraout_var;
    local_40.size_ = extraout_RDX;
    SVar3 = ExtractUserKey(&local_40);
    std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::assign
              (&this->saved_key_,SVar3.data_,SVar3.size_);
    do {
      (*this->iter_->_vptr_Iterator[7])();
      iVar2 = (*this->iter_->_vptr_Iterator[2])();
      if ((char)iVar2 == '\0') {
        this->valid_ = false;
        (this->saved_key_)._M_string_length = 0;
        *(this->saved_key_)._M_dataplus._M_p = '\0';
        ClearSavedValue(this);
        goto LAB_005476ec;
      }
      pCVar1 = this->user_comparator_;
      iVar2 = (*this->iter_->_vptr_Iterator[8])();
      local_50.data_ = (char *)CONCAT44(extraout_var_00,iVar2);
      local_40 = ExtractUserKey(&local_50);
      local_60 = (this->saved_key_)._M_dataplus._M_p;
      local_58 = (this->saved_key_)._M_string_length;
      iVar2 = (*pCVar1->_vptr_Comparator[2])(pCVar1,&local_40,&local_60);
    } while (-1 < iVar2);
    this->direction_ = kReverse;
  }
  FindPrevUserEntry(this);
LAB_005476ec:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void DBIter::Prev() {
  assert(valid_);

  if (direction_ == kForward) {  // Switch directions?
    // iter_ is pointing at the current entry.  Scan backwards until
    // the key changes so we can use the normal reverse scanning code.
    assert(iter_->Valid());  // Otherwise valid_ would have been false
    SaveKey(ExtractUserKey(iter_->key()), &saved_key_);
    while (true) {
      iter_->Prev();
      if (!iter_->Valid()) {
        valid_ = false;
        saved_key_.clear();
        ClearSavedValue();
        return;
      }
      if (user_comparator_->Compare(ExtractUserKey(iter_->key()), saved_key_) <
          0) {
        break;
      }
    }
    direction_ = kReverse;
  }

  FindPrevUserEntry();
}